

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsClutch.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsClutch::ChShaftsClutch(ChShaftsClutch *this,ChShaftsClutch *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChConstraintTwoGenericBoxed *pCVar4;
  undefined1 auVar5 [64];
  
  ChPhysicsItem::ChPhysicsItem((ChPhysicsItem *)this,(ChPhysicsItem *)other);
  (this->super_ChShaftsCouple).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsClutch_00b22a20;
  this->active = true;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.c_i = 0.0
  ;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.l_i = 0.0
  ;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.b_i = 0.0
  ;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.cfm_i =
       0.0;
  auVar5 = ZEXT464(0) << 0x40;
  pCVar4 = &this->constraint;
  (pCVar4->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (pCVar4->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (pCVar4->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (pCVar4->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.active =
       true;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.mode =
       CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.g_i = 0.0
  ;
  *(undefined1 (*) [64])
   &(this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.variables_a = auVar5;
  (this->constraint).super_ChConstraintTwoGeneric.Cq_a = (ChRowVectorDynamic<double>)auVar5._0_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Cq_b = (ChRowVectorDynamic<double>)auVar5._16_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Eq_a = (ChVectorDynamic<double>)auVar5._32_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Eq_b = (ChVectorDynamic<double>)auVar5._48_16_;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.
  _vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoGeneric_00b3af80;
  (this->constraint).l_min = -1.0;
  (this->constraint).l_max = 1.0;
  dVar1 = other->minT;
  dVar2 = other->modulation;
  dVar3 = other->torque_react;
  this->maxT = other->maxT;
  this->minT = dVar1;
  this->modulation = dVar2;
  this->torque_react = dVar3;
  return;
}

Assistant:

ChShaftsClutch::ChShaftsClutch(const ChShaftsClutch& other) : ChShaftsCouple(other), active(true) {
    maxT = other.maxT;
    minT = other.minT;
    modulation = other.modulation;
    torque_react = other.torque_react;
}